

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test::TestBody
          (ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test *this)

{
  ktx_uint8_t *header;
  ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test *pkVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Message *pMVar5;
  uint *__s2;
  ktx_uint32_t in_ECX;
  ktx_uint32_t in_EDX;
  ktxHashList *ppkVar6;
  ktx_uint8_t *__s1;
  ulong uVar7;
  ktxLevelIndexEntry *pkVar8;
  createFlags in_ESI;
  ktxHashListEntry *pkVar9;
  ktx_uint32_t in_R8D;
  char *pcVar10;
  ktx_uint32_t in_R9D;
  undefined4 in_register_0000008c;
  ktx_uint32_t in_stack_ffffffffffffff28;
  ktx_uint64_t levelOffset;
  ktx_uint64_t prevOffset;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  AssertHelper local_b8;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxHashListEntry *pWriter;
  AssertHelper local_80;
  ktxTexture1 *texture;
  ktxHashList *hl;
  ktx_uint8_t *ktxMemFile;
  ktx_uint32_t kvDataLen;
  TextureWriterTestHelper<unsigned_short,_2U,_33324U> *local_58;
  ktxTexture1WriteKTX2TestRG16_Write2DMipmap_Test *local_50;
  ktxLevelIndexEntry *local_48;
  ktx_uint8_t *kvData;
  ktx_size_t ktxMemFileLen;
  
  local_58 = &(this->super_ktxTexture1WriteKTX2TestRG16).
              super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
              super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper;
  TextureWriterTestHelper<unsigned_short,_2U,_33324U>::resize
            (local_58,in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_ffffffffffffff28,
             (ktx_uint32_t)levelOffset);
  texture = (ktxTexture1 *)0x0;
  ktxHashList_Create(&hl);
  local_50 = this;
  result = ktxTexture1_Create(&(this->super_ktxTexture1WriteKTX2TestRG16).
                               super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
                               super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
                               createInfo,1,&texture);
  prevOffset = (ulong)prevOffset._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)&gtest_ar,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&prevOffset);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&prevOffset);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pWriter,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x714,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pWriter,(Message *)&prevOffset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pWriter);
    if (prevOffset != 0) {
      (**(code **)(*(long *)prevOffset + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_c0._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  prevOffset = CONCAT71(prevOffset._1_7_,texture != (ktxTexture1 *)0x0);
  if (texture == (ktxTexture1 *)0x0) {
    testing::Message::Message((Message *)&pWriter);
    std::operator<<((ostream *)(pWriter + 0x10),"ktxTexture1_Create failed: ");
    levelOffset = ktxErrorString(result);
    pMVar5 = testing::Message::operator<<((Message *)&pWriter,(char **)&levelOffset);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prevOffset,(AssertionResult *)0x16292e,"false",
               "true",(char *)CONCAT44(in_register_0000008c,in_R9D));
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x715,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_b8,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    pkVar9 = pWriter;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c0);
    pkVar1 = local_50;
    ppkVar6 = &texture->kvDataHead;
    pcVar10 = (local_50->super_ktxTexture1WriteKTX2TestRG16).
              super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
              super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
              super_WriterTestHelper<unsigned_short,_2U,_33324U>.orientation;
    sVar4 = strlen(pcVar10);
    ktxHashList_AddKVPair(ppkVar6,"KTXorientation",(int)sVar4 + 1,pcVar10);
    ppkVar6 = hl;
    pcVar10 = (pkVar1->super_ktxTexture1WriteKTX2TestRG16).
              super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
              super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
              super_WriterTestHelper<unsigned_short,_2U,_33324U>.orientation_ktx2;
    sVar4 = strlen(pcVar10);
    ktxHashList_AddKVPair(ppkVar6,"KTXorientation",(int)sVar4 + 1,pcVar10);
    ktxHashList_AddKVPair
              (&texture->kvDataHead,"KTXwriter",
               (int)(pkVar1->super_ktxTexture1WriteKTX2TestRG16).
                    super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
                    super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
                    super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_string_length,
               (pkVar1->super_ktxTexture1WriteKTX2TestRG16).
               super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
               super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
               super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_dataplus._M_p);
    ktxHashList_AddKVPair
              (hl,"KTXwriter",
               (int)(pkVar1->super_ktxTexture1WriteKTX2TestRG16).
                    super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
                    super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
                    super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_string_length,
               (pkVar1->super_ktxTexture1WriteKTX2TestRG16).
               super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
               super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
               super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_dataplus._M_p);
    pWriter = (ktxHashListEntry *)0x0;
    ktxHashList_FindEntry(hl,"KTXwriter",&pWriter);
    result = appendLibId(hl,pWriter);
    prevOffset = prevOffset & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)&gtest_ar,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&prevOffset)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prevOffset);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&levelOffset,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x731,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
      if (prevOffset != 0) {
        (**(code **)(*(long *)prevOffset + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    ktxHashList_Sort(hl);
    ktxHashList_Serialize(hl,&kvDataLen,&kvData);
    result = TextureWriterTestHelper<unsigned_short,_2U,_33324U>::copyImagesToTexture
                       (local_58,texture);
    prevOffset = prevOffset & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)&gtest_ar,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&prevOffset)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prevOffset);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&levelOffset,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x737,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
      if (prevOffset != 0) {
        (**(code **)(*(long *)prevOffset + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    bVar2 = TextureWriterTestHelper<unsigned_short,_2U,_33324U>::compareTexture1Images
                      (local_58,texture->pData);
    prevOffset = CONCAT71(prevOffset._1_7_,bVar2);
    levelOffset = CONCAT71(levelOffset._1_7_,1);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"helper.compareTexture1Images(texture->pData)","true",
               (bool *)&prevOffset,(bool *)&levelOffset);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&prevOffset);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&levelOffset,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x739,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
      if (prevOffset != 0) {
        (**(code **)(*(long *)prevOffset + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    result = ktxTexture1_WriteKTX2ToMemory(texture,&ktxMemFile,&ktxMemFileLen);
    local_c0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    prevOffset = CONCAT71(prevOffset._1_7_,result == KTX_SUCCESS);
    if (result == KTX_SUCCESS) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_c0);
      header = ktxMemFile;
      iVar3 = memcmp(ktxMemFile,(anonymous_namespace)::ktxId2,0xc);
      prevOffset = CONCAT44(prevOffset._4_4_,iVar3);
      levelOffset = levelOffset & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"memcmp(header, ktxId2, sizeof(ktxId2))","0",
                 (int *)&prevOffset,(int *)&levelOffset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prevOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&levelOffset,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x744,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
        if (prevOffset != 0) {
          (**(code **)(*(long *)prevOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar2 = WriterTestHelper<unsigned_short,_2U,_33324U>::texinfo::compare
                        (&(local_50->super_ktxTexture1WriteKTX2TestRG16).
                          super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
                          super_ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>.helper.
                          super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo,
                         (KTX_header2 *)header);
      prevOffset = CONCAT71(prevOffset._1_7_,bVar2);
      levelOffset = CONCAT71(levelOffset._1_7_,1);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"helper.texinfo.compare(header)","true",(bool *)&prevOffset,
                 (bool *)&levelOffset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prevOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&levelOffset,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x745,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
        if (prevOffset != 0) {
          (**(code **)(*(long *)prevOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      __s2 = (uint *)vk2dfd(*(undefined4 *)(header + 0xc));
      iVar3 = memcmp(ktxMemFile + *(uint *)(header + 0x30),__s2,(ulong)*__s2);
      prevOffset = CONCAT44(prevOffset._4_4_,iVar3);
      levelOffset = levelOffset & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,
                 "memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset, dfd, *dfd)","0",
                 (int *)&prevOffset,(int *)&levelOffset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prevOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&levelOffset,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x74f,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
        if (prevOffset != 0) {
          (**(code **)(*(long *)prevOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      __s1 = ktxMemFile + *(uint *)(header + 0x38);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"header->keyValueData.byteLength","kvDataLen",
                 (uint *)(header + 0x3c),&kvDataLen);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prevOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&levelOffset,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x753,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
        if (prevOffset != 0) {
          (**(code **)(*(long *)prevOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      iVar3 = memcmp(__s1,kvData,(ulong)kvDataLen);
      prevOffset = CONCAT44(prevOffset._4_4_,iVar3);
      levelOffset = levelOffset & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"memcmp(filePtr, kvData, kvDataLen)","0",(int *)&prevOffset,
                 (int *)&levelOffset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&prevOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&levelOffset,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x754,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&levelOffset,(Message *)&prevOffset);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&levelOffset);
        if (prevOffset != 0) {
          (**(code **)(*(long *)prevOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      prevOffset = 0xffffffffffffffff;
      pkVar8 = (ktxLevelIndexEntry *)(ktxMemFile + 0x50);
      local_48 = pkVar8;
      for (uVar7 = 0;
          uVar7 < (local_58->super_WriterTestHelper<unsigned_short,_2U,_33324U>).numLevels;
          uVar7 = uVar7 + 1) {
        levelOffset = pkVar8->byteOffset;
        local_b8.data_ =
             (AssertHelperData *)
             (levelOffset %
             (ulong)(local_50->super_ktxTexture1WriteKTX2TestRG16).
                    super_ktxTexture1WriteKTX2TestBase<unsigned_short,_2U,_33324U>.
                    requiredLevelAlignment);
        local_80.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)&gtest_ar,"levelOffset % requiredLevelAlignment","0U",
                   (unsigned_long *)&local_b8,(uint *)&local_80);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          pcVar10 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x76e,pcVar10);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_b8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_b8.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"levelOffset","prevOffset",&levelOffset,&prevOffset);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          pcVar10 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x771,pcVar10);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_b8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_b8.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        prevOffset = levelOffset;
        pkVar8 = pkVar8 + 1;
      }
      bVar2 = WriterTestHelper<unsigned_short,_2U,_33324U>::compareRawImages
                        (&local_58->super_WriterTestHelper<unsigned_short,_2U,_33324U>,local_48,
                         ktxMemFile);
      levelOffset = CONCAT71(levelOffset._1_7_,bVar2);
      local_b8.data_._0_1_ = 1;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"helper.compareRawImages(levelIndex, ktxMemFile)","true",
                 (bool *)&levelOffset,(bool *)&local_b8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&levelOffset);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x775,pcVar10);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&levelOffset);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (levelOffset != 0) {
          (**(code **)(*(long *)levelOffset + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      operator_delete(ktxMemFile,1);
      (*texture->vtbl->Destroy)((ktxTexture *)texture);
      return;
    }
    testing::Message::Message((Message *)&levelOffset);
    std::operator<<((ostream *)(levelOffset + 0x10),"ktxTexture_WriteKTX2ToMemory failed: ");
    local_b8.data_ = (AssertHelperData *)ktxErrorString(result);
    pMVar5 = testing::Message::operator<<((Message *)&levelOffset,(char **)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&prevOffset,
               (AssertionResult *)"result == KTX_SUCCESS","false","true",
               (char *)CONCAT44(in_register_0000008c,in_R9D));
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x73f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_80,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar);
    pkVar9 = (ktxHashListEntry *)levelOffset;
  }
  if (pkVar9 != (ktxHashListEntry *)0x0) {
    (**(code **)(*(long *)pkVar9 + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c0);
  return;
}

Assistant:

TEST_F(ktxTexture1WriteKTX2TestRG16, Write2DMipmap) {
    helper.resize(createFlagBits::eMipmapped, 1, 1, 2, 32, 32, 1);
    runTest(true);
}